

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void tokenize(list *list,char *func)

{
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  size_t sVar4;
  TOKEN_TYPE TVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  current_type = T_None;
  current_token = (char *)malloc_(1);
  *current_token = '\0';
  lVar8 = 0;
  uVar9 = 0;
  do {
    lVar7 = lVar8 >> 0x20;
    bVar1 = func[lVar7];
    if ((bVar1 != 0x20) && (bVar1 != 0x2c)) {
      if (current_type == T_None) {
        current_type = T_Operand;
        if ((bVar1 != 0x2e && 9 < (byte)(bVar1 - 0x30)) &&
           ((0x3d < bVar1 - 0x21 ||
            (current_type = T_Operator,
            (0x2000000010005781U >> ((ulong)(bVar1 - 0x21) & 0x3f) & 1) == 0)))) {
          current_type = T_None - ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a);
        }
        bVar1 = func[lVar7];
      }
      uVar6 = (uint)bVar1;
      TVar5 = T_Operand;
      if ((bVar1 != 0x2e && 9 < (byte)(bVar1 - 0x30)) &&
         ((0x3d < uVar6 - 0x21 ||
          (TVar5 = T_Operator, (0x2000000010005781U >> ((ulong)(uVar6 - 0x21) & 0x3f) & 1) == 0))))
      {
        TVar5 = T_None - ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a);
      }
      if ((current_type == T_Operator) || (TVar5 != current_type)) {
        addToken(list,current_token);
        free(current_token);
        current_token = (char *)malloc_(1);
        *current_token = '\0';
        bVar1 = func[lVar7];
        current_type = T_Operand;
        if ((9 < (byte)(bVar1 - 0x30) && bVar1 != 0x2e) &&
           ((0x3d < bVar1 - 0x21 ||
            (current_type = T_Operator,
            (0x2000000010005781U >> ((ulong)(bVar1 - 0x21) & 0x3f) & 1) == 0)))) {
          current_type = T_None - ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a);
        }
        uVar6 = (uint)(byte)func[lVar7];
      }
      if (((char)uVar6 == '-') || (uVar6 == 0x2b)) {
        if (0 < (int)(uint)uVar9) {
          bVar1 = func[(ulong)((uint)uVar9 & 0x7fffffff) - 1];
          if ((((byte)(bVar1 - 0x30) < 10 || bVar1 == 0x2e) || (uVar3 = bVar1 - 0x28, 0x36 < uVar3))
             || ((0x400000002000adU >> ((ulong)uVar3 & 0x3f) & 1) == 0)) goto LAB_001040d9;
          if (list->last != (token *)0x0) {
            _Var2 = isNumber(list->last->value);
            if (_Var2) goto LAB_001040d9;
          }
        }
        current_type = T_Operand;
        free(current_token);
        current_token = (char *)malloc_(2);
        *current_token = func[lVar7];
        current_token[1] = '\0';
      }
      else {
LAB_001040d9:
        appendChar(&current_token,(char)uVar6);
      }
    }
    uVar9 = uVar9 + 1;
    sVar4 = strlen(func);
    lVar8 = lVar8 + 0x100000000;
    if (sVar4 < uVar9) {
      if (*current_token != '\0') {
        addToken(list,current_token);
      }
      free(current_token);
      return;
    }
  } while( true );
}

Assistant:

void tokenize(struct list *list, const char *func)
{
    size_t i;

    current_type = T_None;
    current_token = malloc_(1);
    current_token[0] = '\0';

    for (i = 0; i <= strlen(func); i++) {
        processChar(list, func, i);
    }

    if (strlen(current_token) > 0) {
        addToken(list, current_token);
    }

    free(current_token);
}